

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.h
# Opt level: O2

LPUTF8 utf8::EncodeFull<false>(char16 ch,LPUTF8 ptr,void *bufferEnd)

{
  LPUTF8 puVar1;
  byte bVar2;
  
  bVar2 = (byte)ch;
  if ((ushort)ch < 0x80) {
    CodexAssertOrFailFast(ptr < bufferEnd);
    *ptr = bVar2;
    puVar1 = ptr + 1;
  }
  else if ((ushort)ch < 0x800) {
    puVar1 = ptr + 2;
    CodexAssertOrFailFast(puVar1 <= bufferEnd);
    *ptr = (byte)((ushort)ch >> 6) | 0xc0;
    ptr[1] = bVar2 & 0x3f | 0x80;
  }
  else {
    puVar1 = ptr + 3;
    CodexAssertOrFailFast(puVar1 <= bufferEnd);
    *ptr = (byte)((ushort)ch >> 0xc) | 0xe0;
    ptr[1] = (byte)((ushort)ch >> 6) & 0x3f | 0x80;
    ptr[2] = bVar2 & 0x3f | 0x80;
  }
  return puVar1;
}

Assistant:

LPUTF8 EncodeFull(char16 ch, __out_ecount(3) LPUTF8 ptr, const void * bufferEnd)
    {
        if (ch < 0x0080)
        {
            // One byte
            if (countBytesOnly)
            {
                ptr++;
            }
            else
            {
                CodexAssertOrFailFast(ptr < bufferEnd);
                *ptr++ = static_cast<utf8char_t>(ch);
            }
        }
        else if (ch < 0x0800)
        {
            // Two bytes   : 110yyyxx 10xxxxxx
            if (countBytesOnly)
            {
                ptr += 2;
            }
            else
            {
                CodexAssertOrFailFast(ptr + 2 <= bufferEnd);
                *ptr++ = static_cast<utf8char_t>(ch >> 6) | 0xc0;
                *ptr++ = static_cast<utf8char_t>(ch & 0x3F) | 0x80;
            }
        }
        else
        {
            // Three bytes : 1110yyyy 10yyyyxx 10xxxxxx
            if (countBytesOnly)
            {
                ptr += 3;
            }
            else
            {
                CodexAssertOrFailFast(ptr + 3 <= bufferEnd);
                *ptr++ = static_cast<utf8char_t>(ch >> 12) | 0xE0;
                *ptr++ = static_cast<utf8char_t>((ch >> 6) & 0x3F) | 0x80;
                *ptr++ = static_cast<utf8char_t>(ch & 0x3F) | 0x80;
            }
        }

        return ptr;
    }